

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InterpolateAtOffsetCase::
genFragmentSource_abi_cxx11_(string *__return_storage_ptr__,void *this,int numTargetSamples)

{
  uint uVar1;
  ostream *poVar2;
  bool *pbVar3;
  bool *pbVar4;
  bool *pbVar5;
  ostringstream buf;
  ContextType local_1c4;
  string local_1c0;
  ostream local_1a0;
  
  pbVar5 = (bool *)0x184aaa4;
  pbVar4 = glcts::fixed_sample_locations_values + 1;
  if (*(int *)((long)this + 0x128) != 3) {
    pbVar5 = glcts::fixed_sample_locations_values + 1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  std::operator<<(&local_1a0,"${GLSL_VERSION_DECL}\n${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}");
  uVar1 = *(uint *)((long)this + 0x128);
  if (uVar1 < 3) {
    if (uVar1 == 2) {
      pbVar4 = (bool *)0x18b8194;
    }
    pbVar3 = (bool *)"centroid ";
    if (uVar1 != 1) {
      pbVar3 = pbVar4;
    }
    poVar2 = std::operator<<(&local_1a0,pbVar3);
    poVar2 = std::operator<<(poVar2,"in highp vec2 v_screenPosition;\n");
    poVar2 = std::operator<<(poVar2,pbVar3);
    std::operator<<(poVar2,"in highp vec2 v_offset;\n");
  }
  else if (uVar1 == 3) {
    poVar2 = std::operator<<(&local_1a0,"in highp vec2[2] v_screenPosition;\n");
    std::operator<<(poVar2,"in highp vec2 v_offset;\n");
  }
  poVar2 = std::operator<<(&local_1a0,
                           "layout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tconst highp float threshold = 0.15625; // 4 subpixel bits. Assume 3 accurate bits + 0.03125 for other errors\n\n\thighp vec2 pixelCenter = floor(v_screenPosition"
                          );
  poVar2 = std::operator<<(poVar2,pbVar5);
  poVar2 = std::operator<<(poVar2,
                           ") + vec2(0.5, 0.5);\n\thighp vec2 offsetValue = interpolateAtOffset(v_screenPosition"
                          );
  poVar2 = std::operator<<(poVar2,pbVar5);
  std::operator<<(poVar2,
                  ", v_offset);\n\thighp vec2 refValue = pixelCenter + v_offset;\n\n\tbool valuesEqual = all(lessThan(abs(offsetValue - refValue), vec2(threshold)));\n\tif (valuesEqual)\n\t\tfragColor = vec4(0.0, 1.0, 0.0, 1.0);\n\telse\n\t\tfragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}\n"
                 );
  std::__cxx11::stringbuf::str();
  local_1c4.super_ApiType.m_bits =
       (ApiType)(**(code **)(**(long **)(*(long *)((long)this + 0x70) + 8) + 0x10))();
  anon_unknown_2::specializeShader(__return_storage_ptr__,&local_1c0,&local_1c4);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string InterpolateAtOffsetCase::genFragmentSource (int numTargetSamples) const
{
	DE_UNREF(numTargetSamples);

	const char* const	arrayIndexing = (m_testType == TEST_ARRAY_ELEMENT) ? ("[1]") : ("");
	std::ostringstream	buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}";

	if (m_testType == TEST_QUALIFIER_NONE || m_testType == TEST_QUALIFIER_CENTROID || m_testType == TEST_QUALIFIER_SAMPLE)
	{
		const char* const qualifier = (m_testType == TEST_QUALIFIER_CENTROID) ? ("centroid ") : (m_testType == TEST_QUALIFIER_SAMPLE) ? ("sample ") : ("");
		buf	<< qualifier << "in highp vec2 v_screenPosition;\n"
			<< qualifier << "in highp vec2 v_offset;\n";
	}
	else if (m_testType == TEST_ARRAY_ELEMENT)
	{
		buf << "in highp vec2[2] v_screenPosition;\n"
			<< "in highp vec2 v_offset;\n";
	}
	else
		DE_ASSERT(false);

	buf	<<	"layout(location = 0) out mediump vec4 fragColor;\n"
			"void main (void)\n"
			"{\n"
			"	const highp float threshold = 0.15625; // 4 subpixel bits. Assume 3 accurate bits + 0.03125 for other errors\n" // 0.03125 = mediump epsilon when value = 32 (RENDER_SIZE)
			"\n"
			"	highp vec2 pixelCenter = floor(v_screenPosition" << arrayIndexing << ") + vec2(0.5, 0.5);\n"
			"	highp vec2 offsetValue = interpolateAtOffset(v_screenPosition" << arrayIndexing << ", v_offset);\n"
			"	highp vec2 refValue = pixelCenter + v_offset;\n"
			"\n"
			"	bool valuesEqual = all(lessThan(abs(offsetValue - refValue), vec2(threshold)));\n"
			"	if (valuesEqual)\n"
			"		fragColor = vec4(0.0, 1.0, 0.0, 1.0);\n"
			"	else\n"
			"		fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
			"}\n";

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}